

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
spvtools::utils::SmallVector<unsigned_int,_2UL>::push_back
          (SmallVector<unsigned_int,_2UL> *this,uint *value)

{
  iterator __position;
  size_t sVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
            (this->large_data_)._M_t.
            super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            .
            super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
            ._M_head_impl;
  if ((this_00 == (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) && (this->size_ == 2)) {
    MoveToLargeData(this);
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
              (this->large_data_)._M_t.
              super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              .
              super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
              ._M_head_impl;
  }
  if (this_00 == (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
    sVar1 = this->size_;
    this->small_data_[sVar1] = *value;
    this->size_ = sVar1 + 1;
  }
  else {
    __position._M_current = *(uint **)(this_00 + 8);
    if (__position._M_current == *(uint **)(this_00 + 0x10)) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                (this_00,__position,value);
      return;
    }
    *__position._M_current = *value;
    *(uint **)(this_00 + 8) = __position._M_current + 1;
  }
  return;
}

Assistant:

void push_back(const T& value) {
    if (!large_data_ && size_ == small_size) {
      MoveToLargeData();
    }

    if (large_data_) {
      large_data_->push_back(value);
      return;
    }

    new (small_data_ + size_) T(value);
    ++size_;
  }